

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O1

void __thiscall Centaurus::NFA<unsigned_char>::NFA(NFA<unsigned_char> *this,Stream *stream)

{
  pointer *ppNVar1;
  pointer pNVar2;
  CharClass<unsigned_char> local_48;
  
  (this->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states.
  super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states.
  super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states.
  super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>)._vptr_NFABase =
       (_func_int **)&PTR__NFABase_001a0750;
  pNVar2 = (this->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states.
           super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pNVar2 == (pointer)0x0) {
    std::
    vector<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
    ::_M_realloc_insert<>
              (&(this->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states,
               (iterator)0x0);
  }
  else {
    pNVar2->_vptr_NFABaseState = (_func_int **)&PTR__NFABaseState_001a07d8;
    (pNVar2->m_transitions).
    super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pNVar2->m_transitions).
    super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pNVar2->m_transitions).
    super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppNVar1 = &(this->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states.
               super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppNVar1 = *ppNVar1 + 1;
  }
  local_48._vptr_CharClass = (_func_int **)&PTR__CharClass_0019f4d8;
  local_48.m_ranges.
  super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.m_ranges.
  super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_ranges.
  super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  add_state(this,&local_48);
  local_48._vptr_CharClass = (_func_int **)&PTR__CharClass_0019f4d8;
  std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>::
  ~vector(&local_48.m_ranges);
  parse(this,stream);
  return;
}

Assistant:

NFA(Stream& stream)
    {
        m_states.emplace_back();
        add_state(CharClass<TCHAR>());
        
        parse(stream);
    }